

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base64.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  size_t sVar3;
  void *__ptr;
  FILE *pFVar4;
  char *__s2;
  char *in_64;
  char *out_data;
  char *in_data;
  long size;
  FILE *fp2;
  FILE *fp;
  char *s2;
  char *s;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  s2 = (char *)0x0;
  s = (char *)argv;
  argv_local._0_4_ = argc;
  s2 = (char *)cmime_base64_encode_string(test_string1);
  iVar1 = strcmp(s2,test_string1_base64);
  if (iVar1 != 0) {
    __assert_fail("strcmp(s,test_string1_base64)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                  ,0x2e,"int main(int, const char **)");
  }
  pcVar2 = (char *)cmime_base64_decode_string(s2);
  iVar1 = strcmp(test_string1,pcVar2);
  if (iVar1 == 0) {
    free(pcVar2);
    free(s2);
    asprintf(&s2,"%s/c0001.txt","samples");
    __stream = fopen(s2,"rb");
    if (__stream == (FILE *)0x0) {
      argv_local._4_4_ = -1;
    }
    else {
      free(s2);
      iVar1 = fseek(__stream,0,2);
      if (iVar1 == 0) {
        sVar3 = ftell(__stream);
        rewind(__stream);
        __ptr = calloc(1,sVar3 + 0x14);
        fread(__ptr,1,sVar3,__stream);
        iVar1 = ferror(__stream);
        if (iVar1 == 0) {
          rewind(__stream);
          pFVar4 = fopen("test_base64.out","wb");
          if (pFVar4 == (FILE *)0x0) {
            argv_local._4_4_ = -1;
          }
          else {
            cmime_base64_encode_file(__stream,pFVar4,0);
            pcVar2 = (char *)cmime_base64_encode_string(__ptr);
            sVar3 = ftell(pFVar4);
            rewind(pFVar4);
            __s2 = (char *)calloc(1,sVar3 + 0x14);
            pFVar4 = freopen("test_base64.out","rb",pFVar4);
            fread(__s2,1,sVar3,pFVar4);
            iVar1 = ferror(pFVar4);
            if (iVar1 == 0) {
              iVar1 = strcmp(pcVar2,__s2);
              if (iVar1 != 0) {
                __assert_fail("strcmp(in_64,out_data)==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                              ,0x53,"int main(int, const char **)");
              }
              free(pcVar2);
              free(__s2);
              free(__ptr);
              fclose(pFVar4);
              fclose(__stream);
              iVar1 = remove("test_base64.out");
              if (iVar1 == 0) {
                argv_local._4_4_ = 0;
              }
              else {
                argv_local._4_4_ = -1;
              }
            }
            else {
              argv_local._4_4_ = -1;
            }
          }
        }
        else {
          argv_local._4_4_ = -1;
        }
      }
      else {
        argv_local._4_4_ = -1;
      }
    }
    return argv_local._4_4_;
  }
  __assert_fail("strcmp(test_string1,s2)==0",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/test/test_base64.c"
                ,0x30,"int main(int, const char **)");
}

Assistant:

int main (int argc, char const *argv[]) {
    char *s = NULL;
    char *s2 = NULL;
    FILE *fp = NULL;
    FILE *fp2 = NULL;
    long size = 0;
    char *in_data = NULL;
    char *out_data = NULL;
    char *in_64 = NULL;
    
    s = cmime_base64_encode_string(test_string1);
    assert(strcmp(s,test_string1_base64)==0);
    s2 = cmime_base64_decode_string(s);
    assert(strcmp(test_string1,s2)==0);
    free(s2);
    free(s);
    
    asprintf(&s,"%s/c0001.txt",SAMPLES_DIR);
    if ((fp = fopen(s, "rb")) == NULL) 
        return(-1);
        
    free(s);
    
    if (fseek(fp, 0, SEEK_END)!=0)
        return(-1);
        
    size = ftell(fp);
    rewind(fp); 
    in_data = (char*) calloc(sizeof(char), size + 20);
    fread(in_data, 1, size, fp);
    if(ferror(fp))
        return(-1);

    rewind(fp);
    if ((fp2 = fopen("test_base64.out","wb")) == NULL)
        return(-1);

    cmime_base64_encode_file(fp,fp2,0);
    in_64 = cmime_base64_encode_string(in_data);
    
    size = ftell(fp2);
    rewind(fp2);
    out_data = (char *)calloc(sizeof(char),size + 20);
    fp2 = freopen("test_base64.out","rb",fp2);
    fread(out_data,1,size,fp2);
    if (ferror(fp2))
        return(-1);

    assert(strcmp(in_64,out_data)==0);
    free(in_64);
    free(out_data);
    free(in_data);
    
    fclose(fp2);
    fclose(fp);
    
    if (remove("test_base64.out")!=0)
        return(-1);
    
    return(0);
}